

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineSegment.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineSegment::ChLineSegment(ChLineSegment *this,ChLineSegment *source)

{
  ChLine::ChLine(&this->super_ChLine,&source->super_ChLine);
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_00b3d8b8;
  (this->pA).m_data[0] = 0.0;
  (this->pA).m_data[1] = 0.0;
  (this->pA).m_data[2] = 0.0;
  (this->pB).m_data[0] = 0.0;
  (this->pA).m_data[2] = 0.0;
  (this->pB).m_data[0] = 0.0;
  (this->pB).m_data[1] = 0.0;
  (this->pB).m_data[2] = 0.0;
  if (source != this) {
    (this->pA).m_data[0] = (source->pA).m_data[0];
    (this->pA).m_data[1] = (source->pA).m_data[1];
    (this->pA).m_data[2] = (source->pA).m_data[2];
    (this->pB).m_data[0] = (source->pB).m_data[0];
    (this->pB).m_data[1] = (source->pB).m_data[1];
    (this->pB).m_data[2] = (source->pB).m_data[2];
  }
  return;
}

Assistant:

ChLineSegment::ChLineSegment(const ChLineSegment& source) : ChLine(source) {
    pA = source.pA;
    pB = source.pB;
}